

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

Node * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::buildKDTree
          (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,
          vector<P_*,_std::allocator<P_*>_> *values,uint depth)

{
  allocator<P_*> *this_00;
  size_type sVar1;
  Node *pNVar2;
  reference ppPVar3;
  iterator __last;
  Node *rightNode_00;
  Node *this_01;
  Node *rightNode;
  Node *leftNode;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_e0;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_d8;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_d0;
  undefined1 local_c8 [8];
  vector<P_*,_std::allocator<P_*>_> rightValues;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_a8;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_a0;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_98;
  undefined1 local_90 [8];
  vector<P_*,_std::allocator<P_*>_> leftValues;
  int pivot;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_60;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_58;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_50;
  __normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_> local_48;
  int local_2c;
  Node *pNStack_28;
  int numberOfValues;
  Node *result;
  vector<P_*,_std::allocator<P_*>_> *pvStack_18;
  uint depth_local;
  vector<P_*,_std::allocator<P_*>_> *values_local;
  KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this_local;
  
  result._4_4_ = depth;
  pvStack_18 = values;
  values_local = (vector<P_*,_std::allocator<P_*>_> *)this;
  sVar1 = std::vector<P_*,_std::allocator<P_*>_>::size(values);
  local_2c = (int)sVar1;
  if (local_2c == 1) {
    pNVar2 = (Node *)operator_new(0x18);
    ppPVar3 = std::vector<P_*,_std::allocator<P_*>_>::front(pvStack_18);
    Node::Node(pNVar2,*ppPVar3,(Node *)0x0,(Node *)0x0);
    pNStack_28 = pNVar2;
  }
  else if (local_2c < 1) {
    pNStack_28 = (Node *)0x0;
  }
  else {
    local_48._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::begin(pvStack_18);
    local_60._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::begin(pvStack_18);
    local_58 = __gnu_cxx::__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>::
               operator+(&local_60,(long)(local_2c / 2));
    local_50 = __gnu_cxx::__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>::
               operator+(&local_58,1);
    __last = std::vector<P_*,_std::allocator<P_*>_>::end(pvStack_18);
    std::
    partial_sort<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,kdtree::KDTree<P,3u,P_new,P_delete,P_set,P_less>::buildKDTree(std::vector<P*,std::allocator<P*>>&,unsigned_int)::_lambda(P*,P*)_1_>
              (local_48,local_50,
               (__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>)__last._M_current,
               (uint *)((long)&result + 4));
    leftValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = local_2c / 2;
    local_98._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::begin(pvStack_18);
    local_a8._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::begin(pvStack_18);
    local_a0 = __gnu_cxx::__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>::
               operator+(&local_a8,
                         (long)leftValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = (allocator<P_*> *)
              ((long)&rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<P_*>::allocator(this_00);
    std::vector<P*,std::allocator<P*>>::
    vector<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
              ((vector<P*,std::allocator<P*>> *)local_90,local_98,local_a0,this_00);
    std::allocator<P_*>::~allocator
              ((allocator<P_*> *)
               ((long)&rightValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    local_d8._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::begin(pvStack_18);
    local_d0 = __gnu_cxx::__normal_iterator<P_**,_std::vector<P_*,_std::allocator<P_*>_>_>::
               operator+(&local_d8,
                         (long)leftValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    local_e0._M_current = (P **)std::vector<P_*,_std::allocator<P_*>_>::end(pvStack_18);
    std::allocator<P_*>::allocator((allocator<P_*> *)((long)&leftNode + 7));
    std::vector<P*,std::allocator<P*>>::
    vector<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>,void>
              ((vector<P*,std::allocator<P*>> *)local_c8,local_d0,local_e0,
               (allocator<P_*> *)((long)&leftNode + 7));
    std::allocator<P_*>::~allocator((allocator<P_*> *)((long)&leftNode + 7));
    pNVar2 = buildKDTree(this,(vector<P_*,_std::allocator<P_*>_> *)local_90,result._4_4_ + 1);
    rightNode_00 = buildKDTree(this,(vector<P_*,_std::allocator<P_*>_> *)local_c8,result._4_4_ + 1);
    this_01 = (Node *)operator_new(0x18);
    ppPVar3 = std::vector<P_*,_std::allocator<P_*>_>::at
                        (pvStack_18,
                         (long)leftValues.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_);
    Node::Node(this_01,*ppPVar3,pNVar2,rightNode_00);
    pNStack_28 = this_01;
    std::vector<P_*,_std::allocator<P_*>_>::~vector((vector<P_*,_std::allocator<P_*>_> *)local_c8);
    std::vector<P_*,_std::allocator<P_*>_>::~vector((vector<P_*,_std::allocator<P_*>_> *)local_90);
  }
  updateBoundingBox(this,pNStack_28);
  return pNStack_28;
}

Assistant:

Node *buildKDTree(std::vector<T*> &values, const unsigned int depth = 0) {
			Node *result;

			const int numberOfValues = values.size();

			if (numberOfValues == 1) {
				result = new Node(values.front());
			}
			else if (numberOfValues > 0) {

				std::partial_sort(values.begin(), values.begin() + (numberOfValues / 2) + 1, values.end(),
					[&depth](T *i, T *j) {
					return LESS()(i, j, depth%dim);
				});

				const int pivot = numberOfValues / 2;

				std::vector<T*> leftValues(values.begin(), values.begin() + pivot);
				std::vector<T*> rightValues(values.begin() + pivot, values.end());

				Node *leftNode = buildKDTree(leftValues, depth + 1);
				Node *rightNode = buildKDTree(rightValues, depth + 1);

				result = new Node(values.at(pivot), leftNode, rightNode);
			}
			else { // values.empty()
				result = 0;
			}

			updateBoundingBox(result);

			return result;
		}